

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_long_long,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,format_specs *specs,
          padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::int_writer<unsigned_long_long,_fmt::v6::basic_format_specs<wchar_t>_>::bin_writer<3>_>
          *f)

{
  undefined8 *puVar1;
  long lVar2;
  byte bVar3;
  ulong uVar4;
  fill_t<wchar_t> *fill;
  size_t n;
  wchar_t *local_38;
  
  uVar4 = f->size_;
  n = (uint)specs->width - uVar4;
  if ((uint)specs->width < uVar4 || n == 0) {
    puVar1 = *(undefined8 **)this;
    lVar2 = puVar1[2];
    uVar4 = uVar4 + lVar2;
    if ((ulong)puVar1[3] < uVar4) {
      (**(code **)*puVar1)(puVar1,uVar4);
    }
    puVar1[2] = uVar4;
    local_38 = (wchar_t *)(lVar2 * 4 + puVar1[1]);
    padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_long_long,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
    ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_long_long,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
                  *)f,&local_38);
  }
  else {
    puVar1 = *(undefined8 **)this;
    lVar2 = puVar1[2];
    uVar4 = (specs->fill).size_ * n + uVar4 + lVar2;
    if ((ulong)puVar1[3] < uVar4) {
      (**(code **)*puVar1)(puVar1,uVar4);
    }
    puVar1[2] = uVar4;
    local_38 = (wchar_t *)(lVar2 * 4 + puVar1[1]);
    fill = &specs->fill;
    bVar3 = specs->field_0x9 & 0xf;
    if (bVar3 == 3) {
      local_38 = fill<wchar_t*,wchar_t>(local_38,n >> 1,fill);
      padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_long_long,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
      ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_long_long,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
                    *)f,&local_38);
      n = n - (n >> 1);
    }
    else {
      if (bVar3 == 2) {
        local_38 = fill<wchar_t*,wchar_t>(local_38,n,fill);
        padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_long_long,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
        ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_long_long,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
                      *)f,&local_38);
        return;
      }
      padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_long_long,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
      ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_long_long,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
                    *)f,&local_38);
    }
    fill<wchar_t*,wchar_t>(local_38,n,fill);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    size_t padding = width - num_code_points;
    size_t fill_size = specs.fill.size();
    auto&& it = reserve(size + padding * fill_size);
    if (specs.align == align::right) {
      it = fill(it, padding, specs.fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = fill(it, left_padding, specs.fill);
      f(it);
      it = fill(it, padding - left_padding, specs.fill);
    } else {
      f(it);
      it = fill(it, padding, specs.fill);
    }
  }